

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputClose(Node *this,ostream *os)

{
  ostream *poVar1;
  string sStack_58;
  string local_38;
  
  for (; this->Type == 0x1f5; this = this->Tree[1]) {
    OutputClose(this->Tree[0],os);
  }
  Indent_abi_cxx11_(&local_38,this);
  poVar1 = std::operator<<(os,(string *)&local_38);
  GetIPChannel_abi_cxx11_(&sStack_58,this,0);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_58);
  poVar1 = std::operator<<(poVar1,".close();");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Node::OutputClose(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	switch(Type)
	{
	case BAS_N_LIST:
		Tree[0]->OutputClose(os);
		Tree[1]->OutputClose(os);
		break;

	default:
		os << Indent() <<
			GetIPChannel(this, 0) <<
			".close();" << std::endl;
		break;
	}
}